

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  BYTE *src;
  uint uVar1;
  ZSTD_dStage ZVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ZSTD_dStreamStage ZVar7;
  ZSTD_DDict *pZVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  void *src_00;
  void *pvVar12;
  void *pvVar13;
  void *dst;
  size_t sVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ZSTD_frameSizeInfo ZVar20;
  size_t local_a8;
  void *local_90;
  
  uVar11 = input->pos;
  uVar3 = input->size;
  if (uVar3 < uVar11) {
    local_a8 = 0xffffffffffffffb8;
  }
  else {
    local_a8 = 0xffffffffffffffba;
    if (output->pos <= output->size) {
      src_00 = (void *)(uVar11 + (long)input->src);
      pvVar15 = (void *)(uVar3 + (long)input->src);
      pvVar12 = (void *)(output->pos + (long)output->dst);
      pvVar13 = (void *)(output->size + (long)output->dst);
      src = zds->headerBuffer;
      dst = pvVar12;
      local_90 = src_00;
LAB_0014d276:
      bVar5 = true;
      bVar4 = bVar5;
      switch(zds->streamStage) {
      case zdss_init:
        goto switchD_0014d29a_caseD_0;
      case zdss_loadHeader:
        goto switchD_0014d29a_caseD_1;
      case zdss_read:
        goto switchD_0014d29a_caseD_2;
      case zdss_load:
        goto LAB_0014d7c8;
      case zdss_flush:
        goto switchD_0014d29a_caseD_4;
      default:
        return 0xffffffffffffffff;
      }
    }
  }
  return local_a8;
switchD_0014d29a_caseD_0:
  zds->streamStage = zdss_loadHeader;
  zds->inPos = 0;
  zds->legacyVersion = 0;
  zds->hostageByte = 0;
  zds->lhSize = 0;
  zds->outStart = 0;
  zds->outEnd = 0;
switchD_0014d29a_caseD_1:
  sVar14 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,zds->lhSize,zds->format);
  if (sVar14 < 0xffffffffffffff89) {
    if (sVar14 == 0) {
      iVar6 = 0;
    }
    else {
      sVar10 = zds->lhSize;
      uVar16 = sVar14 - sVar10;
      uVar17 = (long)pvVar15 - (long)local_90;
      if (uVar17 < uVar16) {
        if (pvVar15 != local_90) {
          memcpy(src + sVar10,local_90,uVar17);
          zds->lhSize = zds->lhSize + uVar17;
        }
        input->pos = input->size;
        if (sVar14 < 7) {
          sVar14 = 6;
        }
        iVar6 = 1;
        local_a8 = (sVar14 - zds->lhSize) + 3;
      }
      else {
        memcpy(src + sVar10,local_90,uVar16);
        zds->lhSize = sVar14;
        local_90 = (void *)((long)local_90 + uVar16);
        iVar6 = 4;
      }
    }
  }
  else {
    iVar6 = 1;
    local_a8 = sVar14;
  }
  bVar4 = true;
  bVar5 = true;
  if (iVar6 != 4) {
    if (iVar6 != 0) {
      return local_a8;
    }
    uVar16 = (zds->fParams).frameContentSize;
    if (((uVar16 != 0) && ((zds->fParams).windowSize != 0)) &&
       (uVar16 <= (ulong)((long)pvVar13 - (long)dst))) {
      ZVar20 = ZSTD_findFrameSizeInfo(src_00,uVar3 - uVar11);
      uVar16 = ZVar20.compressedSize;
      if (uVar3 - uVar11 < uVar16) {
        bVar4 = true;
        iVar6 = 0;
      }
      else {
        pZVar8 = ZSTD_getDDict(zds);
        sVar14 = ZSTD_decompressMultiFrame
                           (zds,dst,(long)pvVar13 - (long)dst,src_00,uVar16,(void *)0x0,0,pZVar8);
        bVar4 = 0xffffffffffffff88 < sVar14;
        if (bVar4) {
          iVar6 = 1;
          local_a8 = sVar14;
        }
        else {
          local_90 = (void *)(uVar16 + (long)src_00);
          dst = (void *)((long)dst + sVar14);
          zds->expected = 0;
          zds->streamStage = zdss_init;
          iVar6 = 4;
        }
      }
      if (iVar6 == 4) goto LAB_0014d9e2;
      bVar5 = bVar4;
      if (iVar6 != 0) {
        return local_a8;
      }
    }
    pZVar8 = ZSTD_getDDict(zds);
    ZSTD_decompressBegin_usingDDict(zds,pZVar8);
    if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
      zds->expected = (ulong)*(uint *)(zds->headerBuffer + 4);
      zds->stage = ZSTDds_skipFrame;
    }
    else {
      sVar14 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
      if (0xffffffffffffff88 < sVar14) {
        return sVar14;
      }
      zds->expected = 3;
      zds->stage = ZSTDds_decodeBlockHeader;
    }
    uVar16 = (zds->fParams).windowSize;
    if (uVar16 < 0x401) {
      uVar16 = 0x400;
    }
    (zds->fParams).windowSize = uVar16;
    if (zds->maxWindowSize < uVar16) {
      return 0xfffffffffffffff0;
    }
    uVar1 = (zds->fParams).blockSizeMax;
    if (uVar1 < 5) {
      uVar1 = 4;
    }
    uVar18 = (ulong)uVar1;
    uVar17 = (zds->fParams).frameContentSize;
    uVar19 = 0x20000;
    if (uVar16 < 0x20000) {
      uVar19 = uVar16;
    }
    uVar16 = uVar16 + uVar19 + 0x10;
    if (uVar16 < uVar17) {
      uVar17 = uVar16;
    }
    if ((zds->inBuffSize < uVar18) || (bVar4 = true, zds->outBuffSize < uVar17)) {
      if (zds->staticSize == 0) {
        ZSTD_free(zds->inBuff,zds->customMem);
        bVar4 = false;
        zds->inBuffSize = 0;
        zds->outBuffSize = 0;
        pcVar9 = (char *)ZSTD_malloc(uVar17 + uVar18,zds->customMem);
        zds->inBuff = pcVar9;
        if (pcVar9 != (char *)0x0) goto LAB_0014d679;
        local_a8 = 0xffffffffffffffc0;
      }
      else if (zds->staticSize - 0x271f8 < uVar17 + uVar18) {
        local_a8 = 0xffffffffffffffc0;
        bVar4 = false;
      }
      else {
LAB_0014d679:
        zds->inBuffSize = uVar18;
        zds->outBuff = zds->inBuff + uVar18;
        zds->outBuffSize = uVar17;
        bVar4 = true;
      }
    }
    if (!bVar4) {
      return local_a8;
    }
    zds->streamStage = zdss_read;
switchD_0014d29a_caseD_2:
    uVar16 = zds->expected;
    if (uVar16 == 0) {
      ZVar7 = zdss_init;
      bVar5 = false;
LAB_0014d70c:
      zds->streamStage = ZVar7;
      iVar6 = 4;
      sVar14 = local_a8;
      bVar4 = bVar5;
    }
    else {
      iVar6 = 0;
      sVar14 = local_a8;
      bVar4 = bVar5;
      if (uVar16 <= (ulong)((long)pvVar15 - (long)local_90)) {
        ZVar2 = zds->stage;
        if (ZVar2 == ZSTDds_skipFrame) {
          sVar14 = 0;
        }
        else {
          sVar14 = zds->outBuffSize - zds->outStart;
        }
        sVar10 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar14,local_90,uVar16);
        iVar6 = 1;
        sVar14 = sVar10;
        if ((sVar10 < 0xffffffffffffff89) &&
           ((local_90 = (void *)((long)local_90 + uVar16), ZVar2 == ZSTDds_skipFrame ||
            (iVar6 = 4, sVar14 = local_a8, sVar10 != 0)))) {
          zds->outEnd = zds->outStart + sVar10;
          ZVar7 = zdss_flush;
          goto LAB_0014d70c;
        }
      }
    }
    local_a8 = sVar14;
    if (iVar6 != 4) {
      if (iVar6 != 0) {
        return local_a8;
      }
      if (local_90 == pvVar15) {
        bVar4 = false;
      }
      else {
        zds->streamStage = zdss_load;
LAB_0014d7c8:
        sVar14 = zds->expected;
        sVar10 = zds->inPos;
        uVar17 = sVar14 - sVar10;
        ZVar2 = zds->stage;
        uVar16 = uVar17;
        if (ZVar2 == ZSTDds_skipFrame) {
          if ((ulong)((long)pvVar15 - (long)local_90) <= uVar17) {
            uVar16 = (long)pvVar15 - (long)local_90;
          }
LAB_0014d85e:
          zds->inPos = zds->inPos + uVar16;
          local_90 = (void *)((long)local_90 + uVar16);
          iVar6 = 4;
          if (uVar16 < uVar17) {
            bVar4 = false;
          }
          else {
            sVar14 = ZSTD_decompressContinue
                               (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                                zds->inBuff,sVar14);
            if (sVar14 < 0xffffffffffffff89) {
              zds->inPos = 0;
              if ((ZVar2 == ZSTDds_skipFrame) || (sVar14 != 0)) {
                zds->outEnd = zds->outStart + sVar14;
                iVar6 = 0;
              }
              else {
                zds->streamStage = zdss_read;
              }
            }
            else {
              iVar6 = 1;
              local_a8 = sVar14;
            }
          }
        }
        else {
          if (uVar17 <= zds->inBuffSize - sVar10) {
            if ((ulong)((long)pvVar15 - (long)local_90) <= uVar17) {
              uVar16 = (long)pvVar15 - (long)local_90;
            }
            memcpy(zds->inBuff + sVar10,local_90,uVar16);
            goto LAB_0014d85e;
          }
          local_a8 = 0xffffffffffffffec;
          iVar6 = 1;
        }
        if (iVar6 != 4) {
          if (iVar6 != 0) {
            return local_a8;
          }
          zds->streamStage = zdss_flush;
switchD_0014d29a_caseD_4:
          uVar17 = zds->outEnd - zds->outStart;
          uVar19 = (long)pvVar13 - (long)dst;
          uVar16 = uVar19;
          if (uVar17 <= uVar19) {
            uVar16 = uVar17;
          }
          memcpy(dst,zds->outBuff + zds->outStart,uVar16);
          dst = (void *)((long)dst + uVar16);
          sVar14 = uVar16 + zds->outStart;
          zds->outStart = sVar14;
          if (uVar19 < uVar17) {
            bVar4 = false;
          }
          else {
            zds->streamStage = zdss_read;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (zds->outBuffSize < sVar14 + (zds->fParams).blockSizeMax)) {
              zds->outStart = 0;
              zds->outEnd = 0;
            }
          }
        }
      }
    }
  }
LAB_0014d9e2:
  if (!bVar4) {
    uVar11 = (long)local_90 - (long)input->src;
    input->pos = uVar11;
    output->pos = (long)dst - (long)output->dst;
    if ((local_90 == src_00) && (dst == pvVar12)) {
      iVar6 = zds->noForwardProgress;
      zds->noForwardProgress = iVar6 + 1;
      if (0xe < iVar6) {
        if (dst == pvVar13) {
          return 0xffffffffffffffba;
        }
        if (local_90 == pvVar15) {
          return 0xffffffffffffffb8;
        }
      }
    }
    else {
      zds->noForwardProgress = 0;
    }
    if (zds->expected != 0) {
      return (zds->expected - zds->inPos) + (ulong)(zds->stage == ZSTDds_decompressBlock) * 3;
    }
    if (zds->outEnd == zds->outStart) {
      if (zds->hostageByte != 0) {
        if (input->size <= uVar11) {
          zds->streamStage = zdss_read;
          return 1;
        }
        input->pos = uVar11 + 1;
      }
      return 0;
    }
    if (zds->hostageByte != 0) {
      return 1;
    }
    input->pos = uVar11 - 1;
    zds->hostageByte = 1;
    return 1;
  }
  goto LAB_0014d276;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const istart = (const char*)(input->src) + input->pos;
    const char* const iend = (const char*)(input->src) + input->size;
    const char* ip = istart;
    char* const ostart = (char*)(output->dst) + output->pos;
    char* const oend = (char*)(output->dst) + output->size;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX(ZSTD_FRAMEHEADERSIZE_MIN, hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)));

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);
                if ((zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize)) {
                    size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                    DEBUGLOG(4, "inBuff  : from %u to %u",
                                (U32)zds->inBuffSize, (U32)neededInBuffSize);
                    DEBUGLOG(4, "outBuff : from %u to %u",
                                (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                    if (zds->staticSize) {  /* static DCtx */
                        DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                        assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                        RETURN_ERROR_IF(
                            bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                            memory_allocation);
                    } else {
                        ZSTD_free(zds->inBuff, zds->customMem);
                        zds->inBuffSize = 0;
                        zds->outBuffSize = 0;
                        zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                        RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation);
                    }
                    zds->inBuffSize = neededInBuffSize;
                    zds->outBuff = zds->inBuff + zds->inBuffSize;
                    zds->outBuffSize = neededOutBuffSize;
            }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC);   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));
    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall);
            RETURN_ERROR_IF(ip==iend, srcSize_wrong);
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}